

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadBytes
          (BinaryReader *this,void **out_data,Address *out_data_size,char *desc)

{
  bool bVar1;
  Result RVar2;
  uint32_t local_34;
  char *pcStack_30;
  uint32_t data_size;
  char *desc_local;
  Address *out_data_size_local;
  void **out_data_local;
  BinaryReader *this_local;
  
  local_34 = 0;
  pcStack_30 = desc;
  desc_local = (char *)out_data_size;
  out_data_size_local = (Address *)out_data;
  out_data_local = (void **)this;
  RVar2 = ReadU32Leb128(this,&local_34,"data size");
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = ReadBytesWithSize(this,(void **)out_data_size_local,(ulong)local_34,pcStack_30);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      *(ulong *)desc_local = (ulong)local_34;
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadBytes(const void** out_data,
                               Address* out_data_size,
                               const char* desc) {
  uint32_t data_size = 0;
  CHECK_RESULT(ReadU32Leb128(&data_size, "data size"));
  CHECK_RESULT(ReadBytesWithSize(out_data, data_size, desc));
  *out_data_size = data_size;
  return Result::Ok;
}